

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::verifyLookupTextureData
          (SparseTextureClampLookupResidencyTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  undefined1 *puVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  pointer puVar4;
  GLenum GVar5;
  GLint GVar6;
  GLenum GVar7;
  ostream *poVar8;
  size_t sVar9;
  TestError *this_00;
  int iVar10;
  uint uVar11;
  int sample;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  Functions *pFVar15;
  size_type __new_size;
  GLint depth;
  Functions *local_708;
  GLuint verifyTexture;
  GLint height;
  GLint width;
  allocator<char> local_6f2;
  allocator<char> local_6f1;
  SparseTexture2LookupTestCase *local_6f0;
  GLenum local_6e8;
  GLint local_6e4;
  pointer local_6e0;
  ulong local_6d8;
  int local_6cc;
  GLint local_6c8;
  GLuint fbo;
  ostream *local_6c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  string fragment;
  string vertex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  value_type local_628;
  ShaderProgram program;
  FunctionToken f;
  ProgramSources sources;
  TokenStringsExt s;
  
  puVar1 = &(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
            super_SparseTextureCommitmentTestCase.field_0x88;
  local_708 = gl;
  local_6e4 = format;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"Verify Lookup Residency Texture Data [function: ",0x30);
  local_6c0 = (ostream *)puVar1;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(funcToken->name)._M_dataplus._M_p,
                      (funcToken->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", level: ",9);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
  if ((this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
      super_SparseTextureCommitmentTestCase.mState.levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
               ,0x121);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_6e8 = target;
  local_6c8 = level;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2LookupTestCase).
                     super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.
                     mState,level,&width,&height,&depth);
  GVar7 = local_6e8;
  GVar6 = width;
  bVar14 = true;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
      super_SparseTextureCommitmentTestCase.mState.minDepth <= depth)) {
    if (local_6e8 == 0x8513) {
      depth = depth * 6;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = (size_type)(height * width);
    local_6f0 = &this->super_SparseTexture2LookupTestCase;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    pFVar15 = local_708;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar4 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_6e0 = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,__new_size);
    f.name._M_dataplus._M_p = (pointer)&f.name.field_2;
    pcVar2 = (funcToken->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f,pcVar2,pcVar2 + (funcToken->name)._M_string_length);
    f.arguments._M_dataplus._M_p = (pointer)&f.arguments.field_2;
    pcVar2 = (funcToken->arguments)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f.arguments,pcVar2,pcVar2 + (funcToken->arguments)._M_string_length);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&f.allowedTargets._M_t,&(funcToken->allowedTargets)._M_t);
    gl4cts::Texture::Generate(pFVar15,&verifyTexture);
    gl4cts::Texture::Bind(pFVar15,verifyTexture,0xde1);
    gl4cts::Texture::Storage(pFVar15,0xde1,1,0x8229,width,height,depth);
    GVar5 = (*pFVar15->getError)();
    glu::checkError(GVar5,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x148);
    (*pFVar15->genFramebuffers)(1,&fbo);
    GVar5 = (*local_708->getError)();
    glu::checkError(GVar5,"glGenFramebuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x14c);
    (*local_708->bindFramebuffer)(0x8d40,fbo);
    GVar5 = (*local_708->getError)();
    glu::checkError(GVar5,"glBindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x14e);
    (*local_708->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,verifyTexture,0);
    GVar5 = (*local_708->getError)();
    glu::checkError(GVar5,"glFramebufferTexture2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x150);
    (*local_708->viewport)(0,0,width,height);
    pFVar15 = local_708;
    if (depth < 1) {
      bVar14 = true;
    }
    else {
      local_6cc = GVar6 / 2;
      iVar10 = (((SparseTexture2LookupTestCase *)&local_6f0->super_SparseTexture2CommitmentTestCase)
               ->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               mState.samples;
      bVar14 = true;
      local_6d8 = 0;
      GVar6 = depth;
      do {
        if (0 < iVar10) {
          sample = 0;
          do {
            memset(local_6e0,0,__new_size);
            gl4cts::Texture::Bind(pFVar15,verifyTexture,0xde1);
            gl4cts::Texture::SubImage(pFVar15,0xde1,0,0,0,0,width,height,0,0x1903,0x1401,local_6e0);
            GVar5 = (*pFVar15->getError)();
            glu::checkError(GVar5,"Texture::SubImage",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x15d);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertex,stc_vertex_common,(allocator<char> *)&s);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragment,stc_fragment_lookupResidency,(allocator<char> *)&s);
            SparseTexture2LookupTestCase::createLookupShaderTokens
                      (&s,local_6f0,GVar7,local_6e4,local_6c8,sample,&f);
            replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&vertex);
            replaceToken("<FUNCTION>",f.name._M_dataplus._M_p,&fragment);
            replaceToken("<ARGUMENTS>",f.arguments._M_dataplus._M_p,&fragment);
            replaceToken("<OUTPUT_TYPE>",s.super_TokenStrings.outputType._M_dataplus._M_p,&fragment)
            ;
            replaceToken("<INPUT_TYPE>",s.super_TokenStrings.inputType._M_dataplus._M_p,&fragment);
            replaceToken("<SIZE_DEF>",s.sizeDef._M_dataplus._M_p,&fragment);
            replaceToken("<LOD>",s.lod._M_dataplus._M_p,&fragment);
            replaceToken("<LOD_DEF>",s.lodDef._M_dataplus._M_p,&fragment);
            replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&fragment);
            replaceToken("<ICOORD_TYPE>",s.iCoordType._M_dataplus._M_p,&fragment);
            replaceToken("<COORD_DEF>",s.coordDef._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_TYPE>",s.super_TokenStrings.pointType._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_DEF>",s.super_TokenStrings.pointDef._M_dataplus._M_p,&fragment);
            replaceToken("<RETURN_TYPE>",s.super_TokenStrings.returnType._M_dataplus._M_p,&fragment)
            ;
            replaceToken("<RESULT_EXPECTED>",s.super_TokenStrings.resultExpected._M_dataplus._M_p,
                         &fragment);
            replaceToken("<EPSILON>",s.super_TokenStrings.epsilon._M_dataplus._M_p,&fragment);
            replaceToken("<SAMPLE_DEF>",s.super_TokenStrings.sampleDef._M_dataplus._M_p,&fragment);
            replaceToken("<REFZ_DEF>",s.refZDef._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_COORD>",s.pointCoord._M_dataplus._M_p,&fragment);
            replaceToken("<COMPONENT_DEF>",s.componentDef._M_dataplus._M_p,&fragment);
            replaceToken("<CUBE_MAP_COORD_DEF>",s.cubeMapCoordDef._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_ARRAY_DEF>",s.offsetArrayDef._M_dataplus._M_p,&fragment);
            replaceToken("<FORMAT_DEF>",s.formatDef._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_TYPE>",s.offsetType._M_dataplus._M_p,&fragment);
            replaceToken("<NOFFSET_TYPE>",s.nOffsetType._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_DIM>",s.offsetDim._M_dataplus._M_p,&fragment);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,width);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_WIDTH>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,height);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_HEIGHT>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,depth);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_DEPTH>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&program,vertex._M_dataplus._M_p,&local_6f1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_628,fragment._M_dataplus._M_p,&local_6f2);
            memset(&sources,0,0xac);
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            sources._193_8_ = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(sources.sources,(value_type *)&program);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(sources.sources + 1,&local_628);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_dataplus._M_p != &local_628.field_2) {
              operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1
                             );
            }
            pFVar15 = local_708;
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            glu::ShaderProgram::ShaderProgram
                      (&program,((((SparseTexture2LookupTestCase *)
                                  &local_6f0->super_SparseTexture2CommitmentTestCase)->
                                 super_SparseTexture2CommitmentTestCase).
                                 super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                                m_renderCtx,&sources);
            if (program.m_program.m_info.linkOk == true) {
              (*pFVar15->useProgram)(program.m_program.m_program);
              GVar5 = (*pFVar15->getError)();
              glu::checkError(GVar5,"glUseProgram",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x18d);
              (*pFVar15->activeTexture)(0x84c0);
              GVar5 = (*pFVar15->getError)();
              glu::checkError(GVar5,"glActiveTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x191);
              (*pFVar15->uniform1i)(1,0);
              GVar5 = (*pFVar15->getError)();
              glu::checkError(GVar5,"glUniform1i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x193);
              (*pFVar15->uniform1i)(2,local_6cc);
              GVar5 = (*pFVar15->getError)();
              glu::checkError(GVar5,"glUniform1i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x197);
              (*pFVar15->bindTexture)(GVar7,*texture);
              GVar5 = (*pFVar15->getError)();
              glu::checkError(GVar5,"glBindTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x19a);
              (*pFVar15->clear)(0x4100);
              (**(code **)((long)(((SparseTexture2LookupTestCase *)
                                  &local_6f0->super_SparseTexture2CommitmentTestCase)->
                                 super_SparseTexture2CommitmentTestCase).
                                 super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase
                                 .super_TestNode._vptr_TestNode + 0xa0))
                        (local_6f0,GVar7,local_6d8,&program);
              gl4cts::Texture::Bind(pFVar15,verifyTexture,0xde1);
              gl4cts::Texture::GetData(pFVar15,0,0xde1,0x1903,0x1401,local_6e0);
              GVar7 = (*pFVar15->getError)();
              glu::checkError(GVar7,"Texture::GetData",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x1a1);
              if (0 < (long)height) {
                iVar10 = 0;
                lVar12 = 0;
                do {
                  if (0 < width) {
                    uVar13 = 0;
                    do {
                      bVar14 = (bool)(bVar14 & puVar4[uVar13 + (long)iVar10] ==
                                               local_6e0[uVar13 + (long)iVar10]);
                      uVar13 = uVar13 + 1;
                    } while ((uint)width != uVar13);
                  }
                  lVar12 = lVar12 + 1;
                  iVar10 = iVar10 + width;
                } while (lVar12 != height);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_6c0,"Shader compilation failed (lookup residency) for target: ",0x39)
              ;
              poVar8 = (ostream *)std::ostream::operator<<(local_6c0,GVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", format: ",10);
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_6e4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", vertexInfoLog: ",0x11);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,((*program.m_shaders[0].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog._M_dataplus._M_p,
                                  ((*program.m_shaders[0].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                  _M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", fragmentInfoLog: ",0x13);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,((*program.m_shaders[1].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog._M_dataplus._M_p,
                                  ((*program.m_shaders[1].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                  _M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", programInfoLog: ",0x12);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,program.m_program.m_info.infoLog._M_dataplus._M_p,
                                  program.m_program.m_info.infoLog._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", fragmentSource: ",0x12);
              _Var3 = fragment._M_dataplus;
              if (fragment._M_dataplus._M_p == (pointer)0x0) {
                std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
              }
              else {
                sVar9 = strlen(fragment._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,_Var3._M_p,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
              bVar14 = false;
            }
            glu::ShaderProgram::~ShaderProgram(&program);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&sources.transformFeedbackVaryings);
            std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
            ~vector(&sources.attribLocationBindings);
            lVar12 = 0x78;
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&sources.sources[0].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar12));
              lVar12 = lVar12 + -0x18;
            } while (lVar12 != -0x18);
            SparseTexture2LookupTestCase::TokenStringsExt::~TokenStringsExt(&s);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragment._M_dataplus._M_p != &fragment.field_2) {
              operator_delete(fragment._M_dataplus._M_p,fragment.field_2._M_allocated_capacity + 1);
            }
            GVar7 = local_6e8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertex._M_dataplus._M_p != &vertex.field_2) {
              operator_delete(vertex._M_dataplus._M_p,vertex.field_2._M_allocated_capacity + 1);
            }
            sample = sample + 1;
            iVar10 = (((SparseTexture2LookupTestCase *)
                      &local_6f0->super_SparseTexture2CommitmentTestCase)->
                     super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
                     mState.samples;
            GVar6 = depth;
          } while (sample < iVar10);
        }
        uVar11 = (int)local_6d8 + 1;
        local_6d8 = (ulong)uVar11;
      } while ((int)uVar11 < GVar6);
    }
    (*pFVar15->bindFramebuffer)(0x8d40,0);
    GVar7 = (*local_708->getError)();
    glu::checkError(GVar7,"glBindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x1bb);
    gl4cts::Texture::Delete(local_708,&verifyTexture);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&f.allowedTargets._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.arguments._M_dataplus._M_p != &f.arguments.field_2) {
      operator_delete(f.arguments._M_dataplus._M_p,f.arguments.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.name._M_dataplus._M_p != &f.name.field_2) {
      operator_delete(f.name._M_dataplus._M_p,f.name.field_2._M_allocated_capacity + 1);
    }
    if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar14;
}

Assistant:

bool SparseTextureClampLookupResidencyTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
																		GLuint& texture, GLint level,
																		FunctionToken& funcToken)
{
	mLog << "Verify Lookup Residency Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint  verifyTarget = GL_TEXTURE_2D;
	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, verifyTarget, verifyTexture, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D");

	gl.viewport(0, 0, width, height);

	for (GLint z = 0; z < depth; ++z)
	{
		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, 0, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string vertex   = stc_vertex_common;
			std::string fragment = stc_fragment_lookupResidency;

			// Adjust shader source to texture format
			TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

			replaceToken("<COORD_TYPE>", s.coordType.c_str(), vertex);

			replaceToken("<FUNCTION>", f.name.c_str(), fragment);
			replaceToken("<ARGUMENTS>", f.arguments.c_str(), fragment);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), fragment);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), fragment);
			replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), fragment);
			replaceToken("<LOD>", s.lod.c_str(), fragment);
			replaceToken("<LOD_DEF>", s.lodDef.c_str(), fragment);
			replaceToken("<COORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<ICOORD_TYPE>", s.iCoordType.c_str(), fragment);
			replaceToken("<COORD_DEF>", s.coordDef.c_str(), fragment);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), fragment);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), fragment);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), fragment);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), fragment);
			replaceToken("<EPSILON>", s.epsilon.c_str(), fragment);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), fragment);
			replaceToken("<REFZ_DEF>", s.refZDef.c_str(), fragment);
			replaceToken("<POINT_COORD>", s.pointCoord.c_str(), fragment);
			replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), fragment);
			replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), fragment);
			replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), fragment);
			replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), fragment);
			replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), fragment);
			replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), fragment);
			replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), fragment);

			replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), fragment);
			replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), fragment);
			replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), fragment);

			ProgramSources sources = makeVtxFragSources(vertex.c_str(), fragment.c_str());

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

				// Pass input sampler/image to shader
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.uniform1i(1, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				// Pass committed region width to shader
				gl.uniform1i(2, widthCommitted /* committed region width */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				draw(target, z, program);

				Texture::Bind(gl, verifyTexture, verifyTarget);
				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width;
						GLubyte* outDataRegion = out_data + x + y * width;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
			}
			else
			{
				mLog << "Shader compilation failed (lookup residency) for target: " << target << ", format: " << format
					 << ", vertexInfoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
					 << ", fragmentInfoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
					 << ", programInfoLog: " << program.getProgramInfo().infoLog
					 << ", fragmentSource: " << fragment.c_str() << " - ";

				result = false;
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");

	Texture::Delete(gl, verifyTexture);

	return result;
}